

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

ktx_error_code_e
ktxPrintKTX2InfoJSONForMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktx_uint32_t base_indent,ktx_uint32_t indent_width,
          _Bool minified)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream local_80;
  
  kVar1 = ktxMemStream_construct_ro(&local_80,bytes,size);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxPrintKTX2InfoJSONForStream(&local_80,base_indent,indent_width,minified);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoJSONForMemory(const ktx_uint8_t* bytes, ktx_size_t size, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoJSONForStream(&stream, base_indent, indent_width, minified);
    return result;
}